

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_get_array_item_count(AMQP_VALUE value,uint32_t *count)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || count == (uint32_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x745;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_array_item_count",0x744,1,"Bad arguments: value = %p, count = %p",
                value,count);
    }
  }
  else if (value->type == AMQP_TYPE_ARRAY) {
    *count = (value->value).binary_value.length;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x74f;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_array_item_count",0x74e,1,"Value is not of type ARRAY");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_array_item_count(AMQP_VALUE value, uint32_t* count)
{
    int result;

    /* Tests_SRS_AMQPVALUE_01_421: [ If any of the arguments is NULL, `amqpvalue_get_array_item_count` shall fail and return a non-zero value. ]*/
    if ((value == NULL) ||
        (count == NULL))
    {
        LogError("Bad arguments: value = %p, count = %p",
            value, count);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;

        /* Codes_SRS_AMQPVALUE_01_422: [ If the array argument is not an AMQP value created with the `amqpvalue_create_array` function then `amqpvalue_get_array_item_count` shall fail and return a non-zero value. ]*/
        if (value_data->type != AMQP_TYPE_ARRAY)
        {
            LogError("Value is not of type ARRAY");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_419: [ `amqpvalue_get_array_item_count` shall return in `count` the number of items in the array. ]*/
            *count = value_data->value.array_value.count;

            /* Codes_SRS_AMQPVALUE_01_420: [ On success `amqpvalue_get_array_item_count` shall return 0. ]*/
            result = 0;
        }
    }

    return result;
}